

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icu_backend.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::icu_localization_backend::icu_localization_backend
          (icu_localization_backend *this)

{
  localization_backend *in_RDI;
  cdata *this_00;
  
  localization_backend::localization_backend(in_RDI);
  in_RDI->_vptr_localization_backend = (_func_int **)&PTR__icu_localization_backend_002eb110;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x26f348);
  this_00 = (cdata *)(in_RDI + 4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x26f35b);
  std::__cxx11::string::string((string *)(in_RDI + 7));
  cdata::cdata(this_00);
  std::__cxx11::string::string((string *)(in_RDI + 0x2c));
  std::__cxx11::string::string((string *)(in_RDI + 0x30));
  std::__cxx11::string::string((string *)(in_RDI + 0x34));
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  *(undefined1 *)&in_RDI[0x3c]._vptr_localization_backend = 1;
  *(undefined1 *)((long)&in_RDI[0x3c]._vptr_localization_backend + 1) = 0;
  return;
}

Assistant:

icu_localization_backend() : 
            invalid_(true),
            use_ansi_encoding_(false)
        {
        }